

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O0

void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *p,int fNew,int iNode1st)

{
  int iVar1;
  int i_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_8c;
  ulong local_78;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int Level;
  int c0;
  int low0;
  int high1;
  int high0;
  int nRefedFans;
  int n;
  int cLim;
  int c;
  int k;
  int i;
  int iNode1st_local;
  int fNew_local;
  Abc_EnuMan_t *p_local;
  
  if (p->nNodes == p->nNodeMax) {
    if (p->nTops != 1) {
      __assert_fail("p->nTops == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x23b,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    if (p->fVerbose != 0) {
      Abc_EnumPrintOne(p);
    }
    p->nFinished = p->nFinished + 1;
  }
  else {
    iVar1 = p->fUseXor;
    i_00 = p->nNodes;
    high1 = ((p->nNodeMax - i_00) + 1) - p->nTops;
    if (fNew == 0) {
      iVar2 = p->pFans1[i_00 + -1];
      local_50 = p->pFans0[i_00 + -1];
      local_54 = p->Polar[i_00 + -1];
      iVar4 = iNode1st;
    }
    else {
      local_50 = 0;
      local_54 = 0;
      iVar4 = i_00;
      iVar2 = iNode1st;
    }
    iVar3 = p->pLevel[iVar2];
    if ((p->nTops < 1) || (cLim = iVar2, (p->nNodeMax - i_00) + 1 < p->nTops)) {
      __assert_fail("p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                    ,0x249,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
    }
    for (; cLim < iVar4; cLim = cLim + 1) {
      if ((high1 != 0) || (p->pRefs[cLim] < 1)) {
        if (0 < p->pRefs[cLim]) {
          high1 = high1 + -1;
        }
        if (high1 < 0) {
          __assert_fail("nRefedFans >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                        ,0x251,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
        }
        local_58 = local_50;
        if (cLim != iVar2) {
          local_58 = 0;
        }
        for (c = local_58; c < cLim; c = c + 1) {
          if (((high1 != 0) || (p->pRefs[c] < 1)) &&
             ((((iVar3 != 0 || ((p->pRefs[c] != 0 || (p->pRefs[cLim] != 0)))) ||
               ((c + 1 == cLim && ((c < 1 || (p->pRefs[c + -1] != 0)))))) &&
              (((p->pLevel[cLim] != 0 ||
                (((p->pRefs[cLim] != 0 || (p->pRefs[c] == 0)) || (cLim < 1)))) ||
               (p->pRefs[cLim + -1] != 0)))))) {
            if (((cLim == iVar2) && (c == local_50)) && (fNew == 0)) {
              local_5c = local_54 + 1;
            }
            else {
              local_5c = 0;
            }
            for (n = local_5c; n < iVar1 + 4; n = n + 1) {
              if ((((p->pLevel[c] != 0) || (p->pRefs[c] != 0)) || ((n & 1U) != 1)) &&
                 (((p->pLevel[cLim] != 0 || (p->pRefs[cLim] != 0)) || ((n & 2U) != 2)))) {
                p->nTries = p->nTries + 1;
                if (cLim <= c) {
                  __assert_fail("i < k",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                ,0x266,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                }
                p->pFans0[i_00] = c;
                p->pFans1[i_00] = cLim;
                p->fCompl0[i_00] = n & 1;
                p->fCompl1[i_00] = n >> 1 & 1;
                p->Polar[i_00] = n;
                if (n == 4) {
                  p->pTruths[i_00] = p->pTruths[c] ^ p->pTruths[cLim];
                }
                else {
                  if ((n & 1U) == 0) {
                    local_68 = p->pTruths[c];
                  }
                  else {
                    local_68 = p->pTruths[c] ^ 0xffffffffffffffff;
                  }
                  if ((n & 2U) == 0) {
                    local_78 = p->pTruths[cLim];
                  }
                  else {
                    local_78 = p->pTruths[cLim] ^ 0xffffffffffffffff;
                  }
                  p->pTruths[i_00] = local_68 & local_78;
                }
                iVar5 = Abc_EnumerateFilter(p);
                if (iVar5 == 0) {
                  p->nBuilds = p->nBuilds + 1;
                  iVar5 = Abc_MaxInt(p->pLevel[c],p->pLevel[cLim]);
                  if (iVar3 != iVar5) {
                    __assert_fail("Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k])",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                  ,0x273,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                  }
                  p->pLevel[i_00] = iVar3 + 1;
                  Abc_EnumRefNode(p,i_00);
                  local_8c = iNode1st;
                  if (fNew != 0) {
                    local_8c = i_00;
                  }
                  Abc_EnumerateFuncs_rec(p,0,local_8c);
                  Abc_EnumDerefNode(p,i_00);
                  if (i_00 != p->nNodes) {
                    __assert_fail("n == p->nNodes",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                                  ,0x278,"void Abc_EnumerateFuncs_rec(Abc_EnuMan_t *, int, int)");
                  }
                }
              }
            }
          }
        }
        if (0 < p->pRefs[cLim]) {
          high1 = high1 + 1;
        }
      }
    }
    if (fNew == 0) {
      Abc_EnumerateFuncs_rec(p,1,iNode1st);
    }
  }
  return;
}

Assistant:

void Abc_EnumerateFuncs_rec( Abc_EnuMan_t * p, int fNew, int iNode1st ) // the first node on the last level
{
    if ( p->nNodes == p->nNodeMax )
    {
        assert( p->nTops == 1 );
        if ( p->fVerbose )
            Abc_EnumPrintOne( p );
        p->nFinished++;
        return;
    }
    {
    int i, k, c, cLim = 4 + p->fUseXor, n = p->nNodes;
    int nRefedFans = p->nNodeMax - n + 1 - p->nTops;
    int high0 = fNew ? iNode1st : p->pFans1[n-1];
    int high1 = fNew ? n        : iNode1st;
    int low0  = fNew ? 0        : p->pFans0[n-1];
    int c0    = fNew ? 0        : p->Polar[n-1];
    int Level = p->pLevel[high0];
    assert( p->nTops > 0 && p->nTops <= p->nNodeMax - n + 1 );
    // go through nodes 
    for ( k = high0; k < high1; k++ )
    {
        if ( nRefedFans == 0 && p->pRefs[k] > 0 )
            continue;
        if ( p->pRefs[k] > 0 )
            nRefedFans--;
        assert( nRefedFans >= 0 );
        // try second fanin
        for ( i = (k == high0) ? low0 : 0; i < k; i++ )
        {
            if ( nRefedFans == 0 && p->pRefs[i] > 0 )
                continue;
            if ( Level == 0 && p->pRefs[i] == 0 && p->pRefs[k] == 0 && (i+1 != k || (i > 0 && p->pRefs[i-1] == 0)) ) // NPN
                continue;
            if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && p->pRefs[i] != 0 && k > 0 && p->pRefs[k-1] == 0 ) // NPN
                continue;
//            if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && p->pRefs[k] != 0 && i > 0 && p->pRefs[i-1] == 0 ) // NPN
//                continue;
            // try four polarities
            for ( c = (k == high0 && i == low0 && !fNew) ? c0 + 1 : 0; c < cLim; c++ )
            {
                if ( p->pLevel[i] == 0 && p->pRefs[i] == 0 && (c & 1) == 1 ) // NPN
                    continue;
                if ( p->pLevel[k] == 0 && p->pRefs[k] == 0 && (c & 2) == 2 ) // NPN
                    continue;
                p->nTries++;
                // create node
                assert( i < k );
                p->pFans0[n]  = i;
                p->pFans1[n]  = k;
                p->fCompl0[n] = c & 1;
                p->fCompl1[n] = (c >> 1) & 1;
                p->Polar[n]   = c;
                if ( c == 4 )
                    p->pTruths[n] = p->pTruths[i] ^ p->pTruths[k];
                else
                    p->pTruths[n] = ((c & 1) ? ~p->pTruths[i] : p->pTruths[i]) & ((c & 2) ? ~p->pTruths[k] : p->pTruths[k]);
                if ( Abc_EnumerateFilter(p) )
                    continue;
                p->nBuilds++;
                assert( Level == Abc_MaxInt(p->pLevel[i], p->pLevel[k]) );
                p->pLevel[n]  = Level + 1;
                Abc_EnumRefNode( p, n );
                Abc_EnumerateFuncs_rec( p, 0, fNew ? n : iNode1st );
                Abc_EnumDerefNode( p, n );
                assert( n == p->nNodes );
            }
        }
        if ( p->pRefs[k] > 0 )
            nRefedFans++;
    }
    if ( fNew )
        return;
    // start a new level
    Abc_EnumerateFuncs_rec( p, 1, iNode1st );
    }
}